

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_loop_shape.cc
# Opt level: O2

void __thiscall
S2LaxLoopShape::Init
          (S2LaxLoopShape *this,vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *vertices
          )

{
  pointer __src;
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  pointer __p;
  ulong uVar4;
  size_t __n;
  
  uVar3 = ((long)(vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                _M_impl.super__Vector_impl_data._M_start) / 0x18;
  iVar2 = (int)uVar3;
  *(int *)&(this->super_S2Shape).field_0xc = iVar2;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar2;
  uVar4 = 0xffffffffffffffff;
  if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
    uVar4 = SUB168(auVar1 * ZEXT816(0x18),0);
  }
  __p = (pointer)operator_new__(uVar4);
  if ((uVar3 & 0xffffffff) != 0) {
    uVar4 = (long)iVar2 * 0x18 - 0x18;
    memset(__p,0,(uVar4 - uVar4 % 0x18) + 0x18);
  }
  std::__uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>::reset
            ((__uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_> *)
             &this->vertices_,__p);
  __src = (vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl
          .super__Vector_impl_data._M_start;
  __n = (long)(vertices->super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
              _M_impl.super__Vector_impl_data._M_finish - (long)__src;
  if (__n != 0) {
    memmove((this->vertices_)._M_t.
            super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
            super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
            super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl,__src,__n);
    return;
  }
  return;
}

Assistant:

void S2LaxLoopShape::Init(const vector<S2Point>& vertices) {
  num_vertices_ = vertices.size();
  vertices_.reset(new S2Point[num_vertices_]);
  std::copy(vertices.begin(), vertices.end(), vertices_.get());
}